

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

golf_model_t * golf_entity_get_model(golf_entity_t *entity)

{
  golf_entity_t *entity_local;
  
  switch(entity->type) {
  case MODEL_ENTITY:
    entity_local = (golf_entity_t *)(entity->field_4).model.model;
    break;
  case BALL_START_ENTITY:
    entity_local = (golf_entity_t *)golf_data_get_model("data/models/editor/ball_start.obj");
    break;
  case HOLE_ENTITY:
    entity_local = (golf_entity_t *)golf_data_get_model("data/models/hole.obj");
    break;
  case GEO_ENTITY:
    entity_local = (golf_entity_t *)&(entity->field_4).geo.geo.model;
    break;
  case WATER_ENTITY:
    entity_local = (golf_entity_t *)&(entity->field_4).geo.geo.points.alloc_category;
    break;
  case GROUP_ENTITY:
  case BEGIN_ANIMATION_ENTITY:
  case CAMERA_ZONE_ENTITY:
    entity_local = (golf_entity_t *)0x0;
    break;
  default:
    entity_local = (golf_entity_t *)0x0;
  }
  return (golf_model_t *)entity_local;
}

Assistant:

golf_model_t *golf_entity_get_model(golf_entity_t *entity) {
    switch (entity->type) {
        case MODEL_ENTITY: {
            return entity->model.model;
        }
        case HOLE_ENTITY: {
            return golf_data_get_model("data/models/hole.obj");
        }
        case BALL_START_ENTITY: {
            return golf_data_get_model("data/models/editor/ball_start.obj");
        }
        case GEO_ENTITY: {
            return &entity->geo.geo.model;
        }
        case WATER_ENTITY: {
            return &entity->water.geo.model;
        }
        case CAMERA_ZONE_ENTITY:
        case BEGIN_ANIMATION_ENTITY:
        case GROUP_ENTITY: {
            return NULL;
        }
    }
    return NULL;
}